

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> __thiscall
wabt::MakeUnique<wabt::FuncTypeModuleField,wabt::Location_const&>(wabt *this,Location *args)

{
  FuncTypeModuleField *this_00;
  
  this_00 = (FuncTypeModuleField *)operator_new(0x90);
  FuncTypeModuleField::FuncTypeModuleField(this_00,args,(string_view)ZEXT816(0));
  *(FuncTypeModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}